

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# date.cpp
# Opt level: O1

void __thiscall clickhouse::ColumnDateTime::ColumnDateTime(ColumnDateTime *this,string *timezone)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  shared_ptr<clickhouse::ColumnVector<unsigned_int>_> *this_00;
  undefined1 local_49;
  string local_48;
  element_type *local_28;
  anon_union_8_7_39536558_for_Type_2 local_20;
  
  local_48._M_dataplus._M_p = (timezone->_M_dataplus)._M_p;
  paVar1 = &timezone->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p == paVar1) {
    local_48.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
    local_48.field_2._8_8_ = *(undefined8 *)((long)&timezone->field_2 + 8);
    local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
  }
  else {
    local_48.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
  }
  local_48._M_string_length = timezone->_M_string_length;
  (timezone->_M_dataplus)._M_p = (pointer)paVar1;
  timezone->_M_string_length = 0;
  (timezone->field_2)._M_local_buf[0] = '\0';
  Type::CreateDateTime((Type *)&local_28,&local_48);
  (this->super_Column).super_enable_shared_from_this<clickhouse::Column>._M_weak_this.
  super___weak_ptr<clickhouse::Column,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  (this->super_Column).super_enable_shared_from_this<clickhouse::Column>._M_weak_this.
  super___weak_ptr<clickhouse::Column,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->super_Column)._vptr_Column = (_func_int **)&PTR__Column_0016b560;
  (this->super_Column).type_.super___shared_ptr<clickhouse::Type,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = local_28;
  (this->super_Column).type_.super___shared_ptr<clickhouse::Type,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_20;
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_20.array_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var2 = &((local_20.array_)->item_type).
                super___shared_ptr<clickhouse::Type,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
      *(int *)&p_Var2->_M_pi = *(int *)&p_Var2->_M_pi + 1;
      UNLOCK();
    }
    else {
      p_Var2 = &((local_20.array_)->item_type).
                super___shared_ptr<clickhouse::Type,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
      *(int *)&p_Var2->_M_pi = *(int *)&p_Var2->_M_pi + 1;
    }
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_20.array_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_20.array_);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  (this->super_Column)._vptr_Column = (_func_int **)&PTR__ColumnDateTime_0016b700;
  this_00 = &this->data_;
  (this->data_).
  super___shared_ptr<clickhouse::ColumnVector<unsigned_int>,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<clickhouse::ColumnVector<unsigned_int>,std::allocator<clickhouse::ColumnVector<unsigned_int>>>
            (&(this->data_).
              super___shared_ptr<clickhouse::ColumnVector<unsigned_int>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount,(ColumnVector<unsigned_int> **)this_00,
             (allocator<clickhouse::ColumnVector<unsigned_int>_> *)&local_49);
  std::__shared_ptr<clickhouse::ColumnVector<unsigned_int>,(__gnu_cxx::_Lock_policy)2>::
  _M_enable_shared_from_this_with<clickhouse::ColumnVector<unsigned_int>,clickhouse::ColumnVector<unsigned_int>>
            ((__shared_ptr<clickhouse::ColumnVector<unsigned_int>,(__gnu_cxx::_Lock_policy)2> *)
             this_00,(this_00->
                     super___shared_ptr<clickhouse::ColumnVector<unsigned_int>,_(__gnu_cxx::_Lock_policy)2>
                     )._M_ptr);
  return;
}

Assistant:

ColumnDateTime::ColumnDateTime(std::string timezone)
    : Column(Type::CreateDateTime(std::move(timezone)))
    , data_(std::make_shared<ColumnUInt32>())
{
}